

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

void adjust_frame_rate(AV1_COMP *cpi,int64_t ts_start,int64_t ts_end)

{
  long *plVar1;
  long lVar2;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  double framerate;
  double avg_duration;
  double interval;
  int64_t last_duration;
  int step;
  int64_t this_duration;
  TimeStamps *time_stamps;
  double in_stack_ffffffffffffff98;
  AV1_COMP *in_stack_ffffffffffffffa0;
  AV1_COMP *cpi_00;
  double local_58;
  int local_2c;
  long local_28;
  
  plVar1 = in_RDI + 0xc0eb;
  local_2c = 0;
  if ((((*(int *)(*in_RDI + 0xc750) == 0) || (*(int *)(*in_RDI + 0x14dc0) == 0)) ||
      ((int)in_RDI[0x13a67] < 2)) || (in_RDX - in_RSI < 1)) {
    if (in_RSI == in_RDI[0xc0ed]) {
      local_28 = in_RDX - in_RSI;
      local_2c = 1;
    }
    else {
      lVar2 = in_RDI[0xc0ec] - *plVar1;
      local_28 = in_RDX - in_RDI[0xc0ec];
      if (lVar2 != 0) {
        local_2c = (int)(((local_28 - lVar2) * 10) / lVar2);
      }
    }
    if (local_28 != 0) {
      if (local_2c == 0) {
        if (10000000.0 <= (double)(in_RDX - in_RDI[0xc0ed])) {
          local_58 = 10000000.0;
        }
        else {
          local_58 = (double)(in_RDX - in_RDI[0xc0ed]);
        }
        in_RDI[0x135c7] =
             (long)(10000000.0 /
                   ((((local_58 - 10000000.0 / (double)in_RDI[0xc116]) + (double)local_28) *
                    (10000000.0 / (double)in_RDI[0xc116])) / local_58));
        if (*(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4) < 1) {
          cpi_00 = (AV1_COMP *)in_RDI[0x135c7];
        }
        else {
          cpi_00 = (AV1_COMP *)in_RDI[0xc116];
        }
        av1_new_framerate(cpi_00,in_stack_ffffffffffffff98);
      }
      else {
        in_RDI[0x135c7] = (long)(10000000.0 / (double)local_28);
        av1_new_framerate(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
    *plVar1 = in_RSI;
    in_RDI[0xc0ec] = in_RDX;
  }
  else {
    in_RDI[0x135c7] = (long)(10000000.0 / (double)(in_RDX - in_RSI));
    av1_new_framerate(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *plVar1 = in_RSI;
    in_RDI[0xc0ec] = in_RDX;
  }
  return;
}

Assistant:

static void adjust_frame_rate(AV1_COMP *cpi, int64_t ts_start, int64_t ts_end) {
  TimeStamps *time_stamps = &cpi->time_stamps;
  int64_t this_duration;
  int step = 0;

  // Clear down mmx registers

  if (cpi->ppi->use_svc && cpi->ppi->rtc_ref.set_ref_frame_config &&
      cpi->svc.number_spatial_layers > 1) {
    // ts_start is the timestamp for the current frame and ts_end is the
    // expected next timestamp given the duration passed into codec_encode().
    // See the setting in encoder_encode() in av1_cx_iface.c:
    // ts_start = timebase_units_to_ticks(cpi_data.timestamp_ratio, ptsvol),
    // ts_end = timebase_units_to_ticks(cpi_data.timestamp_ratio, ptsvol +
    // duration). So the difference ts_end - ts_start is the duration passed
    // in by the user. For spatial layers SVC set the framerate based directly
    // on the duration, and bypass the adjustments below.
    this_duration = ts_end - ts_start;
    if (this_duration > 0) {
      cpi->new_framerate = 10000000.0 / this_duration;
      av1_new_framerate(cpi, cpi->new_framerate);
      time_stamps->prev_ts_start = ts_start;
      time_stamps->prev_ts_end = ts_end;
      return;
    }
  }

  if (ts_start == time_stamps->first_ts_start) {
    this_duration = ts_end - ts_start;
    step = 1;
  } else {
    int64_t last_duration =
        time_stamps->prev_ts_end - time_stamps->prev_ts_start;

    this_duration = ts_end - time_stamps->prev_ts_end;

    // do a step update if the duration changes by 10%
    if (last_duration)
      step = (int)((this_duration - last_duration) * 10 / last_duration);
  }

  if (this_duration) {
    if (step) {
      cpi->new_framerate = 10000000.0 / this_duration;
      av1_new_framerate(cpi, cpi->new_framerate);
    } else {
      // Average this frame's rate into the last second's average
      // frame rate. If we haven't seen 1 second yet, then average
      // over the whole interval seen.
      const double interval =
          AOMMIN((double)(ts_end - time_stamps->first_ts_start), 10000000.0);
      double avg_duration = 10000000.0 / cpi->framerate;
      avg_duration *= (interval - avg_duration + this_duration);
      avg_duration /= interval;
      cpi->new_framerate = (10000000.0 / avg_duration);
      // For parallel frames update cpi->framerate with new_framerate
      // during av1_post_encode_updates()
      double framerate =
          (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
              ? cpi->framerate
              : cpi->new_framerate;
      av1_new_framerate(cpi, framerate);
    }
  }

  time_stamps->prev_ts_start = ts_start;
  time_stamps->prev_ts_end = ts_end;
}